

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O0

SFInstrument * __thiscall sf2cute::SFInstrument::operator=(SFInstrument *this,SFInstrument *origin)

{
  bool bVar1;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *pvVar2;
  size_type __n;
  undefined1 local_48 [16];
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *zone;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *__range1;
  SFInstrument *local_18;
  SFInstrument *origin_local;
  SFInstrument *this_local;
  
  local_18 = origin;
  origin_local = this;
  std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
  operator=(&this->global_zone_,(nullptr_t)0x0);
  bVar1 = has_global_zone(local_18);
  if (bVar1) {
    global_zone(local_18);
    std::make_unique<sf2cute::SFInstrumentZone,sf2cute::SFInstrumentZone&>
              ((SFInstrumentZone *)&__range1);
    std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
    operator=(&this->global_zone_,
              (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               *)&__range1);
    std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 *)&__range1);
  }
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::clear(&this->zones_);
  pvVar2 = zones(local_18);
  __n = std::
        vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
        ::size(pvVar2);
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::reserve(&this->zones_,__n);
  pvVar2 = zones(local_18);
  __end1 = std::
           vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ::begin(pvVar2);
  zone = (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *)
         std::
         vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
         ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
                                     *)&zone), bVar1) {
    local_48._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
         ::operator*(&__end1);
    std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
    operator*((unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               *)local_48._8_8_);
    std::make_unique<sf2cute::SFInstrumentZone,sf2cute::SFInstrumentZone&>
              ((SFInstrumentZone *)local_48);
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
    ::push_back(&this->zones_,(value_type *)local_48);
    std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 *)local_48);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator=((string *)this,(string *)local_18);
  this->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(this);
  return this;
}

Assistant:

SFInstrument & SFInstrument::operator=(const SFInstrument & origin) {
  // Copy global zone.
  global_zone_ = nullptr;
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFInstrumentZone>(origin.global_zone());
  }

  // Copy instrument zones.
  zones_.clear();
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFInstrumentZone>(*zone));
  }

  // Copy other fields.
  name_ = origin.name_;
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();

  return *this;
}